

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::PackedSlice::set_up(PackedSlice *this,PackedStruct *struct_,string *member_name)

{
  size_t __n;
  PackedStruct *this_00;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  InternalException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  PackedStructFieldDef *def;
  pointer pPVar4;
  bool bVar5;
  string_view format_str;
  format_args args;
  pointer local_98;
  size_type sStack_90;
  pointer local_88;
  size_type sStack_80;
  string local_70;
  pointer local_50;
  string *local_48;
  PackedStruct *local_40;
  ulong local_38;
  
  pPVar4 = (struct_->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (struct_->attributes).
             super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = struct_;
  if (pPVar4 != local_50) {
    uVar3 = 0;
    local_38 = 0;
    local_48 = member_name;
    do {
      __n = (pPVar4->name)._M_string_length;
      if (__n == member_name->_M_string_length) {
        if (__n == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = bcmp((pPVar4->name)._M_dataplus._M_p,(member_name->_M_dataplus)._M_p,__n);
          bVar5 = iVar1 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      this_00 = pPVar4->struct_;
      if (bVar5) {
        if (this_00 == (PackedStruct *)0x0) {
          uVar2 = pPVar4->width;
        }
        else {
          uVar2 = PackedStruct::bitwidth(this_00);
        }
        (this->super_VarSlice).high = (uVar2 + uVar3) - 1;
        (this->super_VarSlice).low = uVar3;
        (this->super_VarSlice).super_Var.is_signed_ = pPVar4->signed_;
        iVar1 = (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
        (this->super_VarSlice).var_high_ = (iVar1 + uVar3 + uVar2) - 1;
        uVar2 = (this->super_VarSlice).low;
        iVar1 = (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
        uVar2 = iVar1 + uVar2;
        (this->super_VarSlice).var_low_ = uVar2;
        (this->super_VarSlice).super_Var.var_width_ = ((this->super_VarSlice).var_high_ - uVar2) + 1
        ;
        this->def_ = pPVar4;
        local_38 = CONCAT71((uint7)(uint3)(uVar2 >> 8),1);
        member_name = local_48;
      }
      else {
        if (this_00 == (PackedStruct *)0x0) {
          uVar2 = pPVar4->width;
        }
        else {
          uVar2 = PackedStruct::bitwidth(this_00);
        }
        uVar3 = uVar2 + uVar3;
      }
      pPVar4 = pPVar4 + 1;
    } while (!(bool)(bVar5 | pPVar4 == local_50));
    if ((local_38 & 1) != 0) {
      return;
    }
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_98 = (member_name->_M_dataplus)._M_p;
  sStack_90 = member_name->_M_string_length;
  local_88 = (local_40->struct_name)._M_dataplus._M_p;
  sStack_80 = (local_40->struct_name)._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x19;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_70,(detail *)"{0} does not exist in {1}",format_str,args);
  InternalException::InternalException(this_01,&local_70);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PackedSlice::set_up(const kratos::PackedStruct &struct_, const std::string &member_name) {
    // compute the high and low
    uint32_t low_ = 0;
    bool found = false;
    for (auto const &def : struct_.attributes) {
        if (def.name == member_name) {
            found = true;
            high = def.bitwidth() + low_ - 1;
            low = low_;
            is_signed_ = def.signed_;
            var_high_ = high + parent_var->var_low();
            var_low_ = low + parent_var->var_low();
            var_width_ = var_high_ - var_low_ + 1;
            def_ = &def;
            break;
        } else {
            low_ += def.bitwidth();
        }
    }

    if (!found) {
        throw InternalException(
            ::format("{0} does not exist in {1}", member_name, struct_.struct_name));
    }
}